

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

bool Js::BinarySearchForLocale<&unum_getAvailable_70,&unum_countAvailable_70>(char *localeID)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  char *__s2;
  char *pcVar6;
  int iVar7;
  int iVar8;
  char16_t *form;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  iVar4 = unum_countAvailable_70();
  uVar10 = 1;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  iVar7 = iVar4 + -1;
  iVar8 = 0;
  do {
    form = L"%S(): Could not find localeID %S in %d iterations\n";
    if (iVar7 < iVar8) {
LAB_00a333a8:
      Output::Trace(IntlPhase,form,"BinarySearchForLocale",localeID,(ulong)uVar10);
      return iVar8 <= iVar7;
    }
    iVar9 = iVar8 + iVar7;
    iVar11 = (int)((long)iVar9 / 2);
    if (iVar9 < -1 || iVar4 <= iVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3ec,"(i >= 0 && i < count)","i >= 0 && i < count");
      if (!bVar3) goto LAB_00a333d8;
      *puVar5 = 0;
    }
    __s2 = (char *)unum_getAvailable_70((long)iVar9 / 2 & 0xffffffff);
    if (1 < iVar9) {
      pcVar6 = (char *)unum_getAvailable_70(iVar11 + -1);
      iVar9 = strcmp(pcVar6,__s2);
      if (-1 < iVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3f1,
                                    "(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true)"
                                    ,
                                    "i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true"
                                   );
        if (!bVar3) goto LAB_00a333d8;
        *puVar5 = 0;
      }
    }
    if (iVar11 < iVar4 + -1) {
      pcVar6 = (char *)unum_getAvailable_70(iVar11 + 1);
      iVar9 = strcmp(pcVar6,__s2);
      if (iVar9 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3f2,
                                    "(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true)"
                                    ,
                                    "i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true"
                                   );
        if (!bVar3) {
LAB_00a333d8:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    iVar9 = strcmp(localeID,__s2);
    if (iVar9 == 0) {
      form = L"%S(): Found localeID %S in %d iterations\n";
      goto LAB_00a333a8;
    }
    iVar2 = iVar11 + 1;
    if (iVar9 < 0) {
      iVar2 = iVar8;
      iVar7 = iVar11 + -1;
    }
    uVar10 = uVar10 + 1;
    iVar8 = iVar2;
  } while( true );
}

Assistant:

static bool BinarySearchForLocale(const char *localeID)
    {
        const int count = CountAvailableLocalesFunc();
        int left = 0;
        int right = count - 1;
        int iterations = 0;
        while (true)
        {
            iterations += 1;
            if (left > right)
            {
                INTL_TRACE("Could not find localeID %S in %d iterations", localeID, iterations);
                return false;
            }

            int i = (left + right) / 2;
            Assert(i >= 0 && i < count);

            const char *cur = GetAvailableLocalesFunc(i);

            // Ensure that this list is actually binary searchable
            Assert(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true);
            Assert(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true);

            int res = strcmp(localeID, cur);
            if (res == 0)
            {
                INTL_TRACE("Found localeID %S in %d iterations", localeID, iterations);
                return true;
            }
            else if (res < 0)
            {
                right = i - 1;
            }
            else
            {
                left = i + 1;
            }
        }
    }